

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgFullEnumeration(Abc_TgMan_t *pWork,Abc_TgMan_t *pBest)

{
  word *pOut;
  int iVar1;
  Abc_TgMan_t *pBest_local;
  Abc_TgMan_t *pWork_local;
  
  if (pWork->nAlgorithm < 1) {
    Abc_TgFirstPermutation(pWork);
    do {
      Abc_TgPhaseEnumeration(pWork,pBest);
      iVar1 = Abc_TgNextPermutation(pWork);
    } while (iVar1 != 0);
  }
  else {
    pOut = pBest->pTruth;
    iVar1 = Abc_TtWordNum(pBest->nVars);
    Abc_TtFill(pOut,iVar1);
    Abc_TgPhaseEnumerationScc(pWork,pBest);
  }
  pBest->uPhase = pBest->uPhase | 0x40000000;
  return;
}

Assistant:

static void Abc_TgFullEnumeration(Abc_TgMan_t * pWork, Abc_TgMan_t * pBest)
{
    if (pWork->nAlgorithm > 0)
    {
        Abc_TtFill(pBest->pTruth, Abc_TtWordNum(pBest->nVars));
        Abc_TgPhaseEnumerationScc(pWork, pBest);
    }
    else 
    {
        Abc_TgFirstPermutation(pWork);
        do Abc_TgPhaseEnumeration(pWork, pBest);
        while (Abc_TgNextPermutation(pWork));
    }
    pBest->uPhase |= 1 << 30;
}